

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O3

void rhash_sha3_process_block(uint64_t *hash,uint64_t *block,size_t block_size)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint64_t C [5];
  ulong local_88 [6];
  ulong local_58 [5];
  
  *hash = *hash ^ *block;
  hash[1] = hash[1] ^ block[1];
  hash[2] = hash[2] ^ block[2];
  hash[3] = hash[3] ^ block[3];
  hash[4] = hash[4] ^ block[4];
  hash[5] = hash[5] ^ block[5];
  hash[6] = hash[6] ^ block[6];
  hash[7] = hash[7] ^ block[7];
  hash[8] = hash[8] ^ block[8];
  if (0x48 < block_size) {
    hash[9] = hash[9] ^ block[9];
    hash[10] = hash[10] ^ block[10];
    hash[0xb] = hash[0xb] ^ block[0xb];
    hash[0xc] = hash[0xc] ^ block[0xc];
    if (0x68 < block_size) {
      hash[0xd] = hash[0xd] ^ block[0xd];
      hash[0xe] = hash[0xe] ^ block[0xe];
      hash[0xf] = hash[0xf] ^ block[0xf];
      hash[0x10] = hash[0x10] ^ block[0x10];
      if (0x88 < block_size) {
        hash[0x11] = hash[0x11] ^ block[0x11];
      }
    }
  }
  lVar11 = 0;
  do {
    lVar9 = 0;
    do {
      local_58[lVar9] =
           hash[lVar9 + 5] ^ hash[lVar9] ^ hash[lVar9 + 10] ^ hash[lVar9 + 0xf] ^ hash[lVar9 + 0x14]
      ;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 5);
    local_88[0] = (local_58[1] << 1 | (ulong)((long)local_58[1] < 0)) ^ local_58[4];
    local_88[1] = (local_58[2] << 1 | (ulong)((long)local_58[2] < 0)) ^ local_58[0];
    local_88[2] = (local_58[3] << 1 | (ulong)((long)local_58[3] < 0)) ^ local_58[1];
    local_88[3] = (local_58[4] << 1 | (ulong)((long)local_58[4] < 0)) ^ local_58[2];
    local_88[4] = (local_58[0] << 1 | (ulong)((long)local_58[0] < 0)) ^ local_58[3];
    lVar9 = 0;
    do {
      uVar10 = local_88[lVar9];
      hash[lVar9] = hash[lVar9] ^ uVar10;
      hash[lVar9 + 5] = hash[lVar9 + 5] ^ uVar10;
      hash[lVar9 + 10] = hash[lVar9 + 10] ^ uVar10;
      hash[lVar9 + 0xf] = hash[lVar9 + 0xf] ^ uVar10;
      hash[lVar9 + 0x14] = hash[lVar9 + 0x14] ^ uVar10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 5);
    uVar4 = hash[1];
    hash[1] = hash[6] << 0x2c | hash[6] >> 0x14;
    hash[6] = hash[9] << 0x14 | hash[9] >> 0x2c;
    hash[9] = hash[0x16] << 0x3d | hash[0x16] >> 3;
    hash[0x16] = hash[0xe] << 0x27 | hash[0xe] >> 0x19;
    hash[0xe] = hash[0x14] << 0x12 | hash[0x14] >> 0x2e;
    hash[0x14] = hash[2] << 0x3e | hash[2] >> 2;
    hash[2] = hash[0xc] << 0x2b | hash[0xc] >> 0x15;
    hash[0xc] = hash[0xd] << 0x19 | hash[0xd] >> 0x27;
    hash[0xd] = hash[0x13] << 8 | hash[0x13] >> 0x38;
    hash[0x13] = hash[0x17] << 0x38 | hash[0x17] >> 8;
    hash[0x17] = hash[0xf] << 0x29 | hash[0xf] >> 0x17;
    hash[0xf] = hash[4] << 0x1b | hash[4] >> 0x25;
    hash[4] = hash[0x18] << 0xe | hash[0x18] >> 0x32;
    hash[0x18] = hash[0x15] << 2 | hash[0x15] >> 0x3e;
    hash[0x15] = hash[8] << 0x37 | hash[8] >> 9;
    hash[8] = hash[0x10] << 0x2d | hash[0x10] >> 0x13;
    hash[0x10] = hash[5] << 0x24 | hash[5] >> 0x1c;
    hash[5] = hash[3] << 0x1c | hash[3] >> 0x24;
    hash[3] = hash[0x12] << 0x15 | hash[0x12] >> 0x2b;
    hash[0x12] = hash[0x11] << 0xf | hash[0x11] >> 0x31;
    hash[0x11] = hash[0xb] << 10 | hash[0xb] >> 0x36;
    hash[0xb] = hash[7] << 6 | hash[7] >> 0x3a;
    hash[7] = hash[10] << 3 | hash[10] >> 0x3d;
    hash[10] = uVar4 << 1 | (ulong)((long)uVar4 < 0);
    uVar10 = 0xfffffffffffffffb;
    do {
      uVar5 = hash[uVar10 + 5];
      auVar2 = *(undefined1 (*) [16])(hash + uVar10 + 8);
      auVar3 = *(undefined1 (*) [16])(hash + uVar10 + 6);
      uVar12 = (uint)(uVar5 >> 0x20);
      auVar8._8_4_ = (uint)uVar5;
      auVar8._0_8_ = auVar2._8_8_;
      auVar8._12_4_ = uVar12;
      auVar7._8_4_ = auVar2._0_4_;
      auVar7._0_8_ = auVar3._8_8_;
      auVar7._12_4_ = auVar2._4_4_;
      uVar6 = hash[uVar10 + 6];
      puVar1 = hash + uVar10 + 5;
      *(uint *)puVar1 = ~auVar3._0_4_ & auVar3._8_4_ ^ (uint)uVar5;
      *(uint *)((long)puVar1 + 4) = ~auVar3._4_4_ & auVar3._12_4_ ^ uVar12;
      *(uint *)(puVar1 + 1) = ~auVar3._8_4_ & auVar2._0_4_ ^ auVar3._0_4_;
      *(uint *)((long)puVar1 + 0xc) = ~auVar3._12_4_ & auVar2._4_4_ ^ auVar3._4_4_;
      *(undefined1 (*) [16])(hash + uVar10 + 7) = ~auVar2 & auVar8 ^ auVar7;
      hash[uVar10 + 9] = hash[uVar10 + 9] ^ ~uVar5 & uVar6;
      uVar10 = uVar10 + 5;
    } while (uVar10 < 0x14);
    *hash = *hash ^ keccak_round_constants[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x18);
  return;
}

Assistant:

static void rhash_sha3_process_block(uint64_t hash[25], const uint64_t *block, size_t block_size)
{
	/* expanded loop */
	hash[ 0] ^= le2me_64(block[ 0]);
	hash[ 1] ^= le2me_64(block[ 1]);
	hash[ 2] ^= le2me_64(block[ 2]);
	hash[ 3] ^= le2me_64(block[ 3]);
	hash[ 4] ^= le2me_64(block[ 4]);
	hash[ 5] ^= le2me_64(block[ 5]);
	hash[ 6] ^= le2me_64(block[ 6]);
	hash[ 7] ^= le2me_64(block[ 7]);
	hash[ 8] ^= le2me_64(block[ 8]);
	/* if not sha3-512 */
	if (block_size > 72) {
		hash[ 9] ^= le2me_64(block[ 9]);
		hash[10] ^= le2me_64(block[10]);
		hash[11] ^= le2me_64(block[11]);
		hash[12] ^= le2me_64(block[12]);
		/* if not sha3-384 */
		if (block_size > 104) {
			hash[13] ^= le2me_64(block[13]);
			hash[14] ^= le2me_64(block[14]);
			hash[15] ^= le2me_64(block[15]);
			hash[16] ^= le2me_64(block[16]);
			/* if not sha3-256 */
			if (block_size > 136) {
				hash[17] ^= le2me_64(block[17]);
#ifdef FULL_SHA3_FAMILY_SUPPORT
				/* if not sha3-224 */
				if (block_size > 144) {
					hash[18] ^= le2me_64(block[18]);
					hash[19] ^= le2me_64(block[19]);
					hash[20] ^= le2me_64(block[20]);
					hash[21] ^= le2me_64(block[21]);
					hash[22] ^= le2me_64(block[22]);
					hash[23] ^= le2me_64(block[23]);
					hash[24] ^= le2me_64(block[24]);
				}
#endif
			}
		}
	}
	/* make a permutation of the hash */
	rhash_sha3_permutation(hash);
}